

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var * __thiscall cs::runtime_type::parse_access_lhs(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  char *pcVar2;
  _Map_pointer ppaVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this_00;
  _Elt_pointer paVar6;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_01;
  numeric *pnVar7;
  long lVar8;
  undefined *puVar9;
  undefined4 extraout_var_02;
  runtime_error *prVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  const_iterator cVar14;
  anon_union_16_2_310e9938_for_data local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  any local_a8;
  any local_a0;
  ulong local_98;
  undefined2 uStack_90;
  ulong local_80;
  ulong local_70;
  longdouble local_68;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *local_58;
  _Head_base<0UL,_cs_impl::any_&&,_false> local_50;
  _Head_base<0UL,_cs::numeric_&&,_false> local_48;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
  local_40;
  
  if (a->mDat == (proxy *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar5 = (*a->mDat->data->_vptr_baseHolder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var,iVar5);
  }
  pcVar2 = *(char **)(puVar9 + 8);
  if ((pcVar2 == "St5dequeIN7cs_impl3anyESaIS1_EE") ||
     ((*pcVar2 != '*' && (iVar5 = strcmp(pcVar2,"St5dequeIN7cs_impl3anyESaIS1_EE"), iVar5 == 0)))) {
    if (b->mDat == (proxy *)0x0) {
      puVar9 = &void::typeinfo;
    }
    else {
      iVar5 = (*b->mDat->data->_vptr_baseHolder[2])();
      puVar9 = (undefined *)CONCAT44(extraout_var_01,iVar5);
    }
    pcVar2 = *(char **)(puVar9 + 8);
    if ((pcVar2 != "N2cs7numericE") &&
       ((*pcVar2 == '*' || (iVar5 = strcmp(pcVar2,"N2cs7numericE"), iVar5 != 0)))) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_c8._int = (numeric_integer)&local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"Index must be a numeric.","");
      runtime_error::runtime_error(prVar10,(string *)&local_c8);
      __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    this_01 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(a);
    pnVar7 = cs_impl::any::const_val<cs::numeric>(b);
    bVar4 = -1 < (pnVar7->data)._int;
    if (pnVar7->type == false) {
      bVar4 = (longdouble)0 <= *(longdouble *)&pnVar7->data;
    }
    pnVar7 = cs_impl::any::const_val<cs::numeric>(b);
    bVar1 = pnVar7->type;
    if (bVar4) {
      local_80 = (ulong)ROUND(*(longdouble *)&pnVar7->data);
      uVar13 = local_80;
      if (bVar1 != false) {
        uVar13 = (pnVar7->data)._int;
      }
      ppaVar3 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      lVar8 = ((((ulong)((long)ppaVar3 -
                        (long)(this_01->
                              super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                              _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(ppaVar3 == (_Map_pointer)0x0)) * 0x40;
      lVar11 = ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_first >> 3);
      uVar12 = lVar8 + lVar11;
      if ((uVar12 <= uVar13) && (uVar13 - uVar12 != -1)) {
        uVar12 = (lVar8 + lVar11) - 1;
        do {
          local_b8._M_local_buf[0] = '\x01';
          local_c8._int = 0;
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs::numeric>
                    (this_01,(numeric *)&local_c8);
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
    }
    else {
      if (bVar1 == false) {
        local_68 = -*(longdouble *)&pnVar7->data;
      }
      else {
        local_98 = -(pnVar7->data)._int;
        uStack_90 = 0;
        local_68 = (longdouble)(unkuint10)local_98;
      }
      ppaVar3 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      uVar13 = ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
               ((((ulong)((long)ppaVar3 -
                         (long)(this_01->
                               super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                               _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppaVar3 == (_Map_pointer)0x0)) * 0x40;
      bVar4 = (longdouble)(long)uVar13 +
              (longdouble)*(float *)(&DAT_001fac90 + (ulong)((long)uVar13 < 0) * 4) < local_68;
      if (bVar1 != false) {
        bVar4 = uVar13 < local_68._0_8_;
      }
      local_70 = uVar13;
      if (bVar4) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_c8._int = (numeric_integer)&local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Out of range.","");
        runtime_error::runtime_error(prVar10,(string *)&local_c8);
        __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      pnVar7 = cs_impl::any::const_val<cs::numeric>(b);
      lVar8 = (long)ROUND(*(longdouble *)&pnVar7->data);
      if (pnVar7->type != false) {
        lVar8 = (pnVar7->data)._int;
      }
      uVar13 = lVar8 + uVar13;
    }
    paVar6 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    uVar12 = ((long)paVar6 -
              (long)(this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                    _M_impl.super__Deque_impl_data._M_start._M_first >> 3) + uVar13;
    if (uVar12 < 0x40) {
      paVar6 = paVar6 + uVar13;
    }
    else {
      uVar13 = uVar12 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar12) {
        uVar13 = uVar12 >> 6;
      }
      paVar6 = (this_01->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar13] + uVar12 + uVar13 * -0x40;
    }
  }
  else {
    if (a->mDat == (proxy *)0x0) {
      puVar9 = &void::typeinfo;
    }
    else {
      iVar5 = (*a->mDat->data->_vptr_baseHolder[2])();
      puVar9 = (undefined *)CONCAT44(extraout_var_00,iVar5);
    }
    pcVar2 = *(char **)(puVar9 + 8);
    if ((pcVar2 != 
         "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
        ) && ((*pcVar2 == '*' ||
              (iVar5 = strcmp(pcVar2,
                              "N5phmap13flat_hash_mapIN7cs_impl3anyES2_NS_4HashIS2_EENS_7EqualToIS2_EESaISt4pairIKS2_S2_EEEE"
                             ), iVar5 != 0)))) {
      if (a->mDat == (proxy *)0x0) {
        puVar9 = &void::typeinfo;
      }
      else {
        iVar5 = (*a->mDat->data->_vptr_baseHolder[2])();
        puVar9 = (undefined *)CONCAT44(extraout_var_02,iVar5);
      }
      pcVar2 = *(char **)(puVar9 + 8);
      if ((pcVar2 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
         ((*pcVar2 == '*' ||
          (iVar5 = strcmp(pcVar2,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar5 != 0
          )))) {
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
        local_c8._int = (numeric_integer)&local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"Access non-array or string object.","");
        runtime_error::runtime_error(prVar10,(string *)&local_c8);
        __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_c8._int = (numeric_integer)&local_b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,"Access string object as lvalue.","");
      runtime_error::runtime_error(prVar10,(string *)&local_c8);
      __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
               *)cs_impl::any::
                 val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                           (a);
    cVar14 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
             ::find<cs_impl::any>(this_00,b);
    if (cVar14.inner_.ctrl_ == this_00->ctrl_ + this_00->capacity_) {
      local_a8.mDat = b->mDat;
      if (local_a8.mDat != (proxy *)0x0) {
        (local_a8.mDat)->refcount = (local_a8.mDat)->refcount + 1;
      }
      copy((EVP_PKEY_CTX *)&local_a0,(EVP_PKEY_CTX *)&local_a8);
      local_48._M_head_impl = (numeric *)&local_c8;
      local_b8._M_local_buf[0] = '\x01';
      local_c8._int = 0;
      local_58 = this_00;
      local_50._M_head_impl = &local_a0;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
      ::EmplaceDecomposable::operator()
                (&local_40,&local_58,&local_a0,(piecewise_construct_t *)&std::piecewise_construct,
                 (tuple<cs_impl::any_&&> *)&local_50,(tuple<cs::numeric_&&> *)&local_48);
      cs_impl::any::recycle(&local_a0);
      cs_impl::any::recycle(&local_a8);
    }
    paVar6 = phmap::priv::
             raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
             ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                       ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                         *)this_00,b);
  }
  return paVar6;
}

Assistant:

var &runtime_type::parse_access_lhs(const var &a, const var &b)
	{
		if (a.type() == typeid(array)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			auto &arr = a.val<array>();
			std::size_t posit = 0;
			if (b.const_val<numeric>() >= 0) {
				posit = b.const_val<numeric>().as_integer();
				if (posit >= arr.size()) {
					for (std::size_t i = posit - arr.size() + 1; i > 0; --i)
						arr.emplace_back(numeric(0));
				}
			}
			else {
				if (-b.const_val<numeric>() > arr.size())
					throw runtime_error("Out of range.");
				posit = arr.size() + b.const_val<numeric>().as_integer();
			}
			return arr[posit];
		}
		else if (a.type() == typeid(hash_map)) {
			auto &map = a.val<hash_map>();
			if (map.count(b) == 0)
				map.emplace(copy(b), numeric(0));
			return map.at(b);
		}
		else if (a.type() == typeid(string))
			throw runtime_error("Access string object as lvalue.");
		else
			throw runtime_error("Access non-array or string object.");
	}